

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O3

bool cal_run(void)

{
  pointer pGVar1;
  bool bVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  pointer pGVar14;
  int iVar15;
  int iVar16;
  pointer pGVar17;
  pointer pPVar18;
  duration dVar19;
  ulong uVar20;
  ostream *poVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  pointer pPVar25;
  int iVar26;
  long lVar27;
  pointer pGVar28;
  __normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_> __last;
  long lVar29;
  pointer pGVar30;
  int iVar31;
  size_t __n;
  int iVar32;
  int iVar33;
  ulong uVar34;
  __normal_iterator<Grid_*,_std::vector<Grid,_std::allocator<Grid>_>_> __i;
  pointer pGVar35;
  long lVar36;
  float fVar37;
  float fVar38;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  
  dVar19.__r = std::chrono::_V2::system_clock::now();
  pGVar17 = gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  pGVar35 = gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
            _M_start;
  uVar34 = ((long)gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar24 = ((long)planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  lVar27 = (long)gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                 super__Vector_impl_data._M_start;
  logtime.__d.__r = (duration)(duration)dVar19.__r;
  if (gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar29 = 0x3f;
    if (uVar34 != 0) {
      for (; uVar34 >> lVar29 == 0; lVar29 = lVar29 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Grid*,std::vector<Grid,std::allocator<Grid>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Grid_const&,Grid_const&)>>
              ((__normal_iterator<Grid_*,_std::vector<Grid,_std::allocator<Grid>_>_>)
               gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<Grid_*,_std::vector<Grid,_std::allocator<Grid>_>_>)
               gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
               super__Vector_impl_data._M_finish,(ulong)(((uint)lVar29 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Grid_&,_const_Grid_&)>)0x10b352);
    pGVar28 = pGVar35;
    if (lVar27 < 0x181) {
      while (pGVar30 = pGVar28 + 1, pGVar30 != pGVar17) {
        iVar26 = pGVar30->gridSize;
        if (pGVar35->gridSize < iVar26) {
          iVar26 = pGVar30->carrierAtk;
          iVar32 = pGVar30->isFighterOnly;
          uVar10 = pGVar30->carrierPos;
          uVar11 = pGVar30->gridPos;
          uVar12 = pGVar30->gridSize;
          uVar13 = pGVar30->gridSizeFsb;
          memmove((void *)((long)pGVar28 + (0x30 - ((long)pGVar30 - (long)pGVar35))),pGVar35,
                  (long)pGVar30 - (long)pGVar35);
          pGVar35->carrierPos = uVar10;
          pGVar35->gridPos = uVar11;
          pGVar35->gridSize = uVar12;
          pGVar35->gridSizeFsb = uVar13;
          pGVar35->carrierAtk = iVar26;
          pGVar35->isFighterOnly = iVar32;
          pGVar28 = pGVar30;
        }
        else {
          iVar23 = pGVar30->carrierPos;
          iVar33 = pGVar30->gridPos;
          iVar15 = pGVar30->gridSizeFsb;
          iVar16 = pGVar30->carrierAtk;
          iVar31 = pGVar30->isFighterOnly;
          iVar32 = pGVar28->gridSize;
          pGVar28 = pGVar30;
          while (iVar32 < iVar26) {
            iVar32 = pGVar28[-1].isFighterOnly;
            pGVar28->carrierAtk = pGVar28[-1].carrierAtk;
            pGVar28->isFighterOnly = iVar32;
            iVar32 = pGVar28[-1].gridPos;
            iVar4 = pGVar28[-1].gridSize;
            iVar5 = pGVar28[-1].gridSizeFsb;
            pGVar28->carrierPos = pGVar28[-1].carrierPos;
            pGVar28->gridPos = iVar32;
            pGVar28->gridSize = iVar4;
            pGVar28->gridSizeFsb = iVar5;
            iVar32 = pGVar28[-2].gridSize;
            pGVar28 = pGVar28 + -1;
          }
          pGVar28->carrierPos = iVar23;
          pGVar28->gridPos = iVar33;
          pGVar28->gridSize = iVar26;
          pGVar28->gridSizeFsb = iVar15;
          pGVar28->carrierAtk = iVar16;
          pGVar28->isFighterOnly = iVar31;
          pGVar28 = pGVar30;
        }
      }
    }
    else {
      __n = 0x18;
      pGVar30 = pGVar35;
      do {
        pGVar28 = pGVar28 + 1;
        pGVar1 = (pointer)((long)&pGVar35->carrierPos + __n);
        iVar26 = *(int *)((long)&pGVar35->gridSize + __n);
        if (pGVar35->gridSize < iVar26) {
          iVar26 = pGVar1->carrierAtk;
          iVar32 = pGVar1->isFighterOnly;
          uVar6 = pGVar1->carrierPos;
          uVar7 = pGVar1->gridPos;
          uVar8 = pGVar1->gridSize;
          uVar9 = pGVar1->gridSizeFsb;
          memmove((void *)((long)pGVar30 + (0x30 - __n)),pGVar35,__n);
          pGVar35->carrierPos = uVar6;
          pGVar35->gridPos = uVar7;
          pGVar35->gridSize = uVar8;
          pGVar35->gridSizeFsb = uVar9;
          pGVar35->carrierAtk = iVar26;
          pGVar35->isFighterOnly = iVar32;
        }
        else {
          iVar23 = pGVar1->carrierPos;
          iVar33 = pGVar1->gridPos;
          iVar15 = pGVar1->gridSizeFsb;
          iVar16 = pGVar1->carrierAtk;
          iVar31 = pGVar1->isFighterOnly;
          iVar32 = pGVar30->gridSize;
          pGVar30 = pGVar1;
          pGVar14 = pGVar28;
          while (iVar32 < iVar26) {
            pGVar30 = pGVar14 + -1;
            iVar32 = pGVar14[-1].isFighterOnly;
            pGVar14->carrierAtk = pGVar14[-1].carrierAtk;
            pGVar14->isFighterOnly = iVar32;
            iVar32 = pGVar14[-1].gridPos;
            iVar4 = pGVar14[-1].gridSize;
            iVar5 = pGVar14[-1].gridSizeFsb;
            pGVar14->carrierPos = pGVar14[-1].carrierPos;
            pGVar14->gridPos = iVar32;
            pGVar14->gridSize = iVar4;
            pGVar14->gridSizeFsb = iVar5;
            iVar32 = pGVar14[-2].gridSize;
            pGVar14 = pGVar30;
          }
          pGVar30->carrierPos = iVar23;
          pGVar30->gridPos = iVar33;
          pGVar30->gridSize = iVar26;
          pGVar30->gridSizeFsb = iVar15;
          pGVar30->carrierAtk = iVar16;
          pGVar30->isFighterOnly = iVar31;
        }
        __n = __n + 0x18;
        pGVar30 = pGVar1;
      } while (__n != 0x180);
      for (pGVar35 = pGVar35 + 0x10; pGVar35 != pGVar17; pGVar35 = pGVar35 + 1) {
        iVar23 = pGVar35->carrierPos;
        iVar33 = pGVar35->gridPos;
        iVar32 = pGVar35->gridSize;
        iVar31 = pGVar35->isFighterOnly;
        iVar15 = pGVar35->gridSizeFsb;
        iVar16 = pGVar35->carrierAtk;
        iVar26 = pGVar35[-1].gridSize;
        pGVar28 = pGVar35;
        while (iVar26 < iVar32) {
          iVar26 = pGVar28[-1].isFighterOnly;
          pGVar28->carrierAtk = pGVar28[-1].carrierAtk;
          pGVar28->isFighterOnly = iVar26;
          iVar26 = pGVar28[-1].gridPos;
          iVar4 = pGVar28[-1].gridSize;
          iVar5 = pGVar28[-1].gridSizeFsb;
          pGVar28->carrierPos = pGVar28[-1].carrierPos;
          pGVar28->gridPos = iVar26;
          pGVar28->gridSize = iVar4;
          pGVar28->gridSizeFsb = iVar5;
          iVar26 = pGVar28[-2].gridSize;
          pGVar28 = pGVar28 + -1;
        }
        pGVar28->carrierPos = iVar23;
        pGVar28->gridPos = iVar33;
        pGVar28->gridSize = iVar32;
        pGVar28->gridSizeFsb = iVar15;
        pGVar28->carrierAtk = iVar16;
        pGVar28->isFighterOnly = iVar31;
      }
    }
  }
  pPVar18 = planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pPVar25 = planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar20 = ((long)planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    lVar27 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> lVar27 == 0; lVar27 = lVar27 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
              ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
               planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
               planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
               super__Vector_impl_data._M_finish,(ulong)(((uint)lVar27 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b35c);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
              ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)pPVar25,
               (__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)pPVar18,
               (_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b35c);
  }
  iVar26 = -(uint)(0x32 < tarAirSupremacy);
  iVar32 = (int)uVar34;
  uVar22 = (uint)uVar24;
  if (iVar32 < (int)uVar22) {
    uVar24 = uVar34;
  }
  fVar37 = 0.0;
  if ((int)uVar24 < 1) {
    iVar31 = 0;
  }
  else {
    lVar27 = (uVar24 & 0xffffffff) * 0x38;
    fVar37 = 50.0;
    lVar36 = 8;
    iVar31 = 1;
    lVar29 = 0;
    do {
      iVar23 = *(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                                super__Vector_impl_data._M_start)->airSupremacy + lVar29);
      iVar33 = 3;
      if (*(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                           super__Vector_impl_data._M_start)->category + lVar29) == 3) {
        iVar33 = 0x19;
      }
      dVar3 = (double)*(int *)((long)&(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->carrierPos +
                              lVar36);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      fVar37 = fVar37 + (float)(iVar33 + (int)((double)iVar23 * dVar3));
      iVar23 = iVar26;
      if (iVar26 == -1) {
        iVar23 = iVar31;
      }
      if ((float)tarAirSupremacy <= fVar37) {
        iVar26 = iVar23;
      }
      lVar29 = lVar29 + 0x38;
      lVar36 = lVar36 + 0x18;
      iVar31 = iVar31 + 1;
    } while (lVar27 != lVar29);
    if ((int)uVar24 < 1) {
      iVar31 = 0;
      fVar37 = 0.0;
    }
    else {
      lVar29 = 0;
      fVar37 = 0.0;
      lVar36 = 8;
      iVar31 = 0;
      do {
        if (*(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                             super__Vector_impl_data._M_start)->category + lVar29) == 3) {
          iVar31 = iVar31 + 1;
          std::vector<Plane,_std::allocator<Plane>_>::push_back
                    (&planeVecF,
                     (value_type *)
                     ((long)&((planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                               super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar29));
          iVar23 = 3;
          if (*(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                               super__Vector_impl_data._M_start)->category + lVar29) == 3) {
            iVar23 = 0x19;
          }
        }
        else {
          iVar23 = 3;
        }
        iVar33 = *(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl
                                  .super__Vector_impl_data._M_start)->airSupremacy + lVar29);
        dVar3 = (double)*(int *)((long)&(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->carrierPos +
                                lVar36);
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
        fVar37 = fVar37 + (float)(iVar23 + (int)((double)iVar33 * dVar3));
        lVar29 = lVar29 + 0x38;
        lVar36 = lVar36 + 0x18;
      } while (lVar27 != lVar29);
    }
  }
  fVar38 = (float)tarAirSupremacy;
  if (fVar37 < fVar38) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ERROR:FighterPower unreachable.Currently reachable FighterPower: ",0x41);
    poVar21 = std::ostream::_M_insert<double>((double)fVar37);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
    std::ostream::put((char)poVar21);
    std::ostream::flush();
  }
  else {
    iVar23 = 0x10;
    if (iVar31 < 0x10) {
      iVar23 = iVar31;
    }
    if (iVar23 < iVar26) {
      iVar26 = iVar23;
    }
    curFighterNum = iVar26;
    do {
      std::vector<Plane,_std::allocator<Plane>_>::clear(&planeVecA);
      if (0 < (int)uVar22) {
        lVar27 = 0;
        uVar24 = (ulong)(uVar22 & 0x7fffffff);
        pPVar25 = planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          if (*(int *)((long)&pPVar25->category + lVar27) - 1U < 2) {
            std::vector<Plane,_std::allocator<Plane>_>::push_back
                      (&planeVecA,(value_type *)((long)&(pPVar25->name)._M_dataplus._M_p + lVar27));
            pPVar25 = planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          lVar27 = lVar27 + 0x38;
          uVar24 = uVar24 - 1;
        } while (uVar24 != 0);
      }
      pPVar18 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pPVar25 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
          super__Vector_impl_data._M_start !=
          planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar24 = ((long)planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        lVar27 = 0x3f;
        if (uVar24 != 0) {
          for (; uVar24 >> lVar27 == 0; lVar27 = lVar27 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
                  ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                   planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                   planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                   super__Vector_impl_data._M_finish,(ulong)(((uint)lVar27 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b3bb);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
                  ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)pPVar25,
                   (__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)pPVar18,
                   (_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b3bb);
        pPVar25 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      pPVar18 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                super__Vector_impl_data._M_start;
      curBomberNum = iVar32 - curFighterNum;
      iVar31 = (int)((ulong)((long)pPVar25 -
                            (long)planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar26 = iVar31 * -0x49249249;
      if (SBORROW4(curBomberNum,iVar26) == curBomberNum + iVar31 * 0x49249249 < 0) {
        curBomberNum = iVar26;
      }
      if (attackerAbleGridNum < curBomberNum) {
        curBomberNum = attackerAbleGridNum;
      }
      flushFlag = true;
      if (curBomberNum == 0) {
        iVar26 = 0;
      }
      else {
        uVar24 = (ulong)curBomberNum;
        __last._M_current =
             planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
             super__Vector_impl_data._M_start + uVar24;
        lVar27 = 0x3f;
        if (uVar24 != 0) {
          for (; uVar24 >> lVar27 == 0; lVar27 = lVar27 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
                  ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                   planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                   super__Vector_impl_data._M_start,__last,(ulong)(((uint)lVar27 ^ 0x3f) * 2) ^ 0x7e
                   ,(_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b592);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
                  ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)pPVar18,
                   __last,(_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b592);
        iVar26 = curBomberNum;
      }
      atkdp(iVar26);
      sign[0x1c] = 0;
      sign[0x1d] = 0;
      sign[0x1e] = 0;
      sign[0x1f] = 0;
      sign[0x18] = 0;
      sign[0x19] = 0;
      sign[0x1a] = 0;
      sign[0x1b] = 0;
      sign[0x14] = 0;
      sign[0x15] = 0;
      sign[0x16] = 0;
      sign[0x17] = 0;
      sign[0x10] = 0;
      sign[0x11] = 0;
      sign[0x12] = 0;
      sign[0x13] = 0;
      sign[0xc] = 0;
      sign[0xd] = 0;
      sign[0xe] = 0;
      sign[0xf] = 0;
      sign[8] = 0;
      sign[9] = 0;
      sign[10] = 0;
      sign[0xb] = 0;
      sign[4] = 0;
      sign[5] = 0;
      sign[6] = 0;
      sign[7] = 0;
      sign[0] = 0;
      sign[1] = 0;
      sign[2] = 0;
      sign[3] = 0;
      baoliSearch(0,curFighterNum,curBomberNum,iVar32);
      iVar26 = curFighterNum + 1;
      bVar2 = curFighterNum < iVar23;
      curFighterNum = iVar26;
    } while (bVar2);
    lVar27 = std::chrono::_V2::system_clock::now();
    restime.__r = (lVar27 - dVar19.__r) / 1000;
  }
  return fVar38 <= fVar37;
}

Assistant:

bool cal_run(){//if available result
    auto starttime=std::chrono::system_clock::now();
    logtime=starttime;
    //prepare
    int gridSz=gridVec.size(),planeSz=planeVec.size();
    sort(gridVec.begin(),gridVec.end(),cal_cmp_grid);

    //choose fighters.
    int minFighterNum=-1,maxFighterNum=0;

    sort(planeVec.begin(),planeVec.end(),cal_cmp_plane_AS);

    //cal min
    float tAS=PRESET_AS_OF_BOMBER;//AirSupermacy Val
    if(tAS>=tarAirSupremacy)minFighterNum=0;
    for(int i=0;i<gridSz&&i<planeSz;i++){
        tAS+=AS_PROF_BONOUS(planeVec[i])+formulaFighter(gridVec[i].gridSize,planeVec[i].airSupremacy);
        if(tAS>=tarAirSupremacy&&minFighterNum==-1){
            minFighterNum=i+1;
        }
    }
    //cal max
    tAS=0;
    for(int i=0;i<gridSz&&i<planeSz;i++){
        if(planeVec[i].category == PLANE_FIGHTER){
            maxFighterNum++;
            planeVecF.push_back(planeVec[i]);
        }
        tAS+=AS_PROF_BONOUS(planeVec[i])+formulaFighter(gridVec[i].gridSize,planeVec[i].airSupremacy);
    }
    if(tAS<tarAirSupremacy){
        cout<<"ERROR:FighterPower unreachable.Currently reachable FighterPower: "<<tAS<<endl;
        return false;
    }
    maxFighterNum=min(maxFighterNum,16);
    minFighterNum = min(minFighterNum, maxFighterNum);

    //for all possibility
    for(curFighterNum=minFighterNum;curFighterNum<=maxFighterNum;curFighterNum++){
        //choose bombers.
        planeVecA.clear();
        for(int i=0;i<planeSz;i++){
            Plane &tplane=planeVec[i];
            if(tplane.category==PLANE_BOMBER||tplane.category==PLANE_TORPEDO_ATTACKER)
                planeVecA.push_back(tplane);
        }
        sort(planeVecA.begin(),planeVecA.end(),cal_cmp_plane_damage);
        curBomberNum=min(gridSz-curFighterNum,(int)planeVecA.size());
        curBomberNum=min(curBomberNum,attackerAbleGridNum);
        flushFlag=1;//if copy resVecA
//        cout<<curBomberNum<<endl;
//        if(curBomberNum>CBN_LIMIT){
//            cout<<"ERROR:Too much bomber, curBomberNum: "<<curBomberNum<<"  LIMIT: "<<CBN_LIMIT-1<<endl;
//            return false;
//        }

//        cout<<curBomberNum<<endl;
        sort(planeVecA.begin(),planeVecA.begin()+curBomberNum,cal_cmp_plane_damageOP);

        //dfs all bombers assignments
        atkdp(curBomberNum);
//        cout<<"dp finished"<<endl;
        // 0-1 search
        memset(sign,0,sizeof(sign));
        baoliSearch(0,curFighterNum,curBomberNum,gridSz);
    }
    restime=std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::system_clock::now() - starttime);

    return true;
}